

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

HashElem * findElementGivenHash(Hash *pH,char *pKey,int nKey,uint h)

{
  int iVar1;
  _ht *pEntry;
  HashElem *pHStack_30;
  int count;
  HashElem *elem;
  uint h_local;
  int nKey_local;
  char *pKey_local;
  Hash *pH_local;
  
  if (pH->ht == (_ht *)0x0) {
    pHStack_30 = pH->first;
    pEntry._4_4_ = pH->count;
  }
  else {
    pHStack_30 = pH->ht[h].chain;
    pEntry._4_4_ = pH->ht[h].count;
  }
  while( true ) {
    if (pEntry._4_4_ == 0 || pHStack_30 == (HashElem *)0x0) {
      return (HashElem *)0x0;
    }
    if ((pHStack_30->nKey == nKey) &&
       (iVar1 = sqlite3_strnicmp(pHStack_30->pKey,pKey,nKey), iVar1 == 0)) break;
    pHStack_30 = pHStack_30->next;
    pEntry._4_4_ = pEntry._4_4_ - 1;
  }
  return pHStack_30;
}

Assistant:

static HashElem *findElementGivenHash(
  const Hash *pH,     /* The pH to be searched */
  const char *pKey,   /* The key we are searching for */
  int nKey,           /* Bytes in key (not counting zero terminator) */
  unsigned int h      /* The hash for this key. */
){
  HashElem *elem;                /* Used to loop thru the element list */
  int count;                     /* Number of elements left to test */

  if( pH->ht ){
    struct _ht *pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
  }else{
    elem = pH->first;
    count = pH->count;
  }
  while( count-- && ALWAYS(elem) ){
    if( elem->nKey==nKey && sqlite3StrNICmp(elem->pKey,pKey,nKey)==0 ){ 
      return elem;
    }
    elem = elem->next;
  }
  return 0;
}